

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition>::relocate
          (QArrayDataPointer<QStyleOptionViewItem::ViewItemPosition> *this,qsizetype offset,
          ViewItemPosition **data)

{
  ViewItemPosition *d_first;
  ViewItemPosition *pVVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QStyleOptionViewItem::ViewItemPosition,long_long>
            (this->ptr,this->size,d_first);
  if (data != (ViewItemPosition **)0x0) {
    pVVar1 = *data;
    if ((this->ptr <= pVVar1) && (pVVar1 < this->ptr + this->size)) {
      *data = pVVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }